

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  Result RVar7;
  TargetType TVar8;
  size_type sVar9;
  reference pbVar10;
  ulong uVar11;
  const_reference pvVar12;
  char *pcVar13;
  cmMakefile *this_00;
  ostream *poVar14;
  string *psVar15;
  char *pcVar16;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar18;
  char *local_a60;
  char *local_a38;
  char *local_a10;
  char *local_9e8;
  char *local_9c0;
  char *local_998;
  cmGeneratorTarget *local_970;
  byte local_7f1;
  allocator local_7b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  allocator local_791;
  string local_790;
  undefined1 local_76a;
  allocator local_769;
  char *local_768;
  char *propContent_4;
  char *local_758;
  char *propContent_3;
  char *local_748;
  char *propContent_2;
  char *local_738;
  char *propContent_1;
  char *local_728;
  char *propContent;
  string local_718;
  cmLinkImplementationLibraries *local_6f8;
  cmLinkImplementationLibraries *impl;
  cmLinkInterfaceLibraries *local_6d0;
  cmLinkInterfaceLibraries *iface;
  cmGeneratorTarget *headTarget;
  char *pcStack_6b8;
  PolicyStatus polSt;
  byte local_6a9;
  undefined1 local_6a8 [7];
  bool isInterfaceProperty;
  string interfacePropertyName;
  string linkedTargetsContent;
  string local_660;
  string local_640;
  char *local_620;
  char *prop;
  size_t i;
  undefined1 local_5f0 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_520;
  string local_500;
  allocator local_4d9;
  string local_4d8;
  string local_4b8;
  allocator local_491;
  string local_490;
  string local_470;
  _Base_ptr local_450;
  undefined1 local_448;
  _Base_ptr local_440;
  undefined1 local_438;
  _Base_ptr local_430;
  undefined1 local_428;
  string local_420;
  string local_400;
  undefined1 local_3e0 [8];
  ostringstream e;
  allocator local_261;
  cmGeneratorTarget *local_260;
  cmGeneratorTarget *tgt;
  string local_250;
  string local_230;
  allocator local_209;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [8];
  string targetName;
  string local_1a0;
  string local_180;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  allocator local_151;
  string local_150;
  string local_130;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  int local_108;
  allocator local_101;
  string local_100;
  string local_e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  undefined1 local_b8 [8];
  string propertyName;
  cmGeneratorTarget *target;
  allocator local_79;
  string local_78;
  string local_58;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *dagCheckerParent_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetPropertyNode *this_local;
  string *result;
  
  local_38 = dagCheckerParent;
  dagCheckerParent_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (TargetPropertyNode *)__return_storage_ptr__;
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(parameters);
  if ((sVar9 != 1) &&
     (sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local), pGVar1 = content_local, sVar9 != 2)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_58,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "$<TARGET_PROPERTY:...> expression requires one or two parameters",&local_79);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar5 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  propertyName.field_2._8_8_ =
       content_local[5].IdentifierChildren.
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_c0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)context_local);
  pbVar10 = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_c0);
  std::__cxx11::string::string((string *)local_b8,(string *)pbVar10);
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)context_local);
  if (sVar9 == 1) {
    *(undefined1 *)
     ((long)&content_local[5].ParamChildren.
             super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3) = 1;
  }
  if ((propertyName.field_2._8_8_ == 0) &&
     (sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local), pGVar1 = content_local, sVar9 == 1)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_e0,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_100,
               "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
               ,&local_101);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_e0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_108 = 1;
    goto LAB_005f9807;
  }
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)context_local);
  if (sVar9 == 2) {
    local_110._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)context_local);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_110);
    uVar6 = std::__cxx11::string::empty();
    local_7f1 = 0;
    if ((uVar6 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)context_local,1);
      local_7f1 = std::__cxx11::string::empty();
    }
    pGVar1 = content_local;
    if ((local_7f1 & 1) != 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_130,(GeneratorExpressionContent *)dagCheckerParent_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_150,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name."
                 ,&local_151);
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_130,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_108 = 1;
      goto LAB_005f9807;
    }
    local_160._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)context_local);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_160);
    uVar11 = std::__cxx11::string::empty();
    pGVar1 = content_local;
    if ((uVar11 & 1) != 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_180,(GeneratorExpressionContent *)dagCheckerParent_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a0,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.",
                 (allocator *)(targetName.field_2._M_local_buf + 0xf));
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_180,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_108 = 1;
      goto LAB_005f9807;
    }
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)context_local);
    std::__cxx11::string::string((string *)local_1c8,(string *)pvVar12);
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)context_local,1);
    std::__cxx11::string::operator=((string *)local_b8,(string *)pvVar12);
    bVar2 = cmGeneratorExpression::IsValidTargetName((string *)local_1c8);
    if (bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"ALIASED_TARGET");
      if (bVar2) {
        this_00 = cmLocalGenerator::GetMakefile
                            ((cmLocalGenerator *)
                             content_local[4].IdentifierChildren.
                             super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        bVar2 = cmMakefile::IsAlias(this_00,(string *)local_1c8);
        if ((bVar2) &&
           (local_260 = cmLocalGenerator::FindGeneratorTargetToUse
                                  ((cmLocalGenerator *)
                                   content_local[4].IdentifierChildren.
                                   super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(string *)local_1c8),
           local_260 != (cmGeneratorTarget *)0x0)) {
          psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(local_260);
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar15);
          local_108 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_261);
          std::allocator<char>::~allocator((allocator<char> *)&local_261);
          local_108 = 1;
        }
      }
      else {
        propertyName.field_2._8_8_ =
             cmLocalGenerator::FindGeneratorTargetToUse
                       ((cmLocalGenerator *)
                        content_local[4].IdentifierChildren.
                        super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(string *)local_1c8);
        if ((cmGeneratorTarget *)propertyName.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
          poVar14 = std::operator<<((ostream *)local_3e0,"Target \"");
          poVar14 = std::operator<<(poVar14,(string *)local_1c8);
          std::operator<<(poVar14,"\" not found.");
          pGVar1 = content_local;
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    (&local_400,(GeneratorExpressionContent *)dagCheckerParent_local);
          std::__cxx11::ostringstream::str();
          reportError((cmGeneratorExpressionContext *)pGVar1,&local_400,&local_420);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          local_108 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
        }
        else {
          pVar18 = std::
                   set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                             *)&content_local[1].ParamChildren.
                                super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                            (value_type *)((long)&propertyName.field_2 + 8));
          local_430 = (_Base_ptr)pVar18.first._M_node;
          local_428 = pVar18.second;
          local_108 = 0;
        }
      }
    }
    else {
      pcVar13 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find(&Evaluate::propertyNameValidator,pcVar13);
      pGVar1 = content_local;
      if (bVar2) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_230,(GeneratorExpressionContent *)dagCheckerParent_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_250,"Target name not supported.",(allocator *)((long)&tgt + 7));
        reportError((cmGeneratorExpressionContext *)pGVar1,&local_230,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tgt + 7));
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_108 = 1;
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_1e8,(GeneratorExpressionContent *)dagCheckerParent_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_208,"Target name and property name not supported.",&local_209);
        reportError((cmGeneratorExpressionContext *)pGVar1,&local_1e8,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_108 = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_1c8);
    if (local_108 != 0) goto LAB_005f9807;
  }
  if ((pointer)propertyName.field_2._8_8_ ==
      content_local[5].IdentifierChildren.
      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pVar17 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&content_local[2].IdentifierChildren.
                          super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(value_type *)local_b8);
    local_440 = (_Base_ptr)pVar17.first._M_node;
    local_438 = pVar17.second;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,"SOURCES");
  if (bVar2) {
    pVar18 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                       *)&content_local[2].ContentLength,
                      (value_type *)((long)&propertyName.field_2 + 8));
    local_450 = (_Base_ptr)pVar18.first._M_node;
    local_448 = pVar18.second;
  }
  uVar11 = std::__cxx11::string::empty();
  pGVar1 = content_local;
  if ((uVar11 & 1) != 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_470,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_490,
               "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",&local_491);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_470,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_108 = 1;
    goto LAB_005f9807;
  }
  bVar2 = cmsys::RegularExpression::find(&Evaluate::propertyNameValidator,(string *)local_b8);
  pGVar1 = content_local;
  if (!bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_4b8,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4d8,"Property name not supported.",&local_4d9);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_4b8,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_108 = 1;
    goto LAB_005f9807;
  }
  if (propertyName.field_2._8_8_ == 0) {
    __assert_fail("target",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                  ,999,
                  "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                 );
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,"LINKER_LANGUAGE");
  pGVar1 = content_local;
  if (bVar2) {
    bVar2 = cmGeneratorTarget::LinkLanguagePropagatesToDependents
                      ((cmGeneratorTarget *)propertyName.field_2._8_8_);
    if (((bVar2) && (local_38 != (cmGeneratorExpressionDAGChecker *)0x0)) &&
       ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(local_38,(char *)0x0),
        bVar2 || (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(local_38), bVar2)))) {
      pGVar1 = content_local;
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_500,(GeneratorExpressionContent *)dagCheckerParent_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_520,
                 "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                 ,(allocator *)&dagChecker.field_0xc7);
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_500,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator((allocator<char> *)&dagChecker.field_0xc7);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_108 = 1;
    }
    else {
      cmGeneratorTarget::GetLinkerLanguage
                (__return_storage_ptr__,(cmGeneratorTarget *)propertyName.field_2._8_8_,
                 (string *)
                 &content_local[4].IdentifierChildren.
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_108 = 1;
    }
    goto LAB_005f9807;
  }
  psVar15 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)propertyName.field_2._8_8_);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_5f0,(cmListFileBacktrace *)pGVar1,psVar15,
             (string *)local_b8,(GeneratorExpressionContent *)dagCheckerParent_local,local_38);
  RVar7 = cmGeneratorExpressionDAGChecker::Check((cmGeneratorExpressionDAGChecker *)local_5f0);
  pGVar1 = content_local;
  switch(RVar7) {
  case SELF_REFERENCE:
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&i,(GeneratorExpressionContent *)dagCheckerParent_local);
    cmGeneratorExpressionDAGChecker::ReportError
              ((cmGeneratorExpressionDAGChecker *)local_5f0,(cmGeneratorExpressionContext *)pGVar1,
               (string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_108 = 1;
    break;
  case CYCLIC_REFERENCE:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_108 = 1;
    break;
  case ALREADY_SEEN:
    for (prop = (char *)0x1; pcVar13 = prop,
        pcVar16 = (char *)cmArraySize<char_const*,8ul>(&targetPropertyTransitiveWhitelist),
        pcVar13 < pcVar16; prop = prop + 1) {
      bVar2 = std::operator==(targetPropertyTransitiveWhitelist[(long)prop],
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8);
      if (bVar2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_108 = 1;
        goto LAB_005f97eb;
      }
    }
  case DAG:
  default:
    local_620 = cmGeneratorTarget::GetProperty
                          ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8);
    if (local_38 != (cmGeneratorExpressionDAGChecker *)0x0) {
      bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(local_38,(char *)0x0);
      if (bVar2) {
        bVar2 = std::operator==("INCLUDE_DIRECTORIES",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8);
        if ((((((bVar2) ||
               (bVar2 = std::operator==("INTERFACE_INCLUDE_DIRECTORIES",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2)) ||
              (bVar2 = std::operator==("SYSTEM_INCLUDE_DIRECTORIES",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2)) ||
             ((bVar2 = std::operator==("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2 ||
              (bVar2 = std::operator==("COMPILE_DEFINITIONS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2)))) ||
            (((bVar2 = std::operator==("INTERFACE_COMPILE_DEFINITIONS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2 ||
              ((bVar2 = std::operator==("COMPILE_OPTIONS",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2 ||
               (bVar2 = std::operator==("INTERFACE_COMPILE_OPTIONS",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2)))) ||
             (bVar2 = std::operator==("AUTOUIC_OPTIONS",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8), bVar2)))) ||
           ((((bVar2 = std::operator==("INTERFACE_AUTOUIC_OPTIONS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2 ||
              (bVar2 = std::operator==("SOURCES",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2)) ||
             (bVar2 = std::operator==("INTERFACE_SOURCES",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8), bVar2)) ||
            ((bVar2 = std::operator==("COMPILE_FEATURES",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8), bVar2 ||
             (bVar2 = std::operator==("INTERFACE_COMPILE_FEATURES",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8), bVar2)))))) {
          pGVar1 = content_local;
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    (&local_640,(GeneratorExpressionContent *)dagCheckerParent_local);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_660,
                     "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                     ,(allocator *)(linkedTargetsContent.field_2._M_local_buf + 0xf));
          reportError((cmGeneratorExpressionContext *)pGVar1,&local_640,&local_660);
          std::__cxx11::string::~string((string *)&local_660);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(linkedTargetsContent.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_640);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          local_108 = 1;
        }
        else {
          if (local_620 != (char *)0x0) goto LAB_005f88ac;
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          local_108 = 1;
        }
        break;
      }
      bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(local_38);
      bVar2 = true;
      if (!bVar3) {
        bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories(local_38);
        bVar2 = true;
        if (!bVar3) {
          bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(local_38);
          bVar2 = true;
          if (!bVar3) {
            bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(local_38);
            bVar2 = true;
            if (!bVar3) {
              bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions(local_38);
              bVar2 = true;
              if (!bVar3) {
                bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources(local_38);
                bVar2 = true;
                if (!bVar3) {
                  bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures(local_38);
                  bVar2 = true;
                  if (!bVar3) {
                    bVar2 = false;
                  }
                }
              }
            }
          }
        }
      }
      if (!bVar2) {
        __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                      ,0x434,
                      "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                     );
      }
    }
LAB_005f88ac:
    std::__cxx11::string::string((string *)(interfacePropertyName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_6a8);
    local_6a9 = 0;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"INCLUDE_DIRECTORIES");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_INCLUDE_DIRECTORIES");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"INTERFACE_INCLUDE_DIRECTORIES");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_INCLUDE_DIRECTORIES");
        local_6a9 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"SYSTEM_INCLUDE_DIRECTORIES");
        if (bVar2) {
          std::__cxx11::string::operator=
                    ((string *)local_6a8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
          if (bVar2) {
            std::__cxx11::string::operator=
                      ((string *)local_6a8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
            local_6a9 = 1;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"COMPILE_DEFINITIONS");
            if (bVar2) {
              std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_COMPILE_DEFINITIONS");
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"INTERFACE_COMPILE_DEFINITIONS");
              if (bVar2) {
                std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_COMPILE_DEFINITIONS")
                ;
                local_6a9 = 1;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8,"COMPILE_OPTIONS");
                if (bVar2) {
                  std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_COMPILE_OPTIONS");
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b8,"INTERFACE_COMPILE_OPTIONS");
                  if (bVar2) {
                    std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_COMPILE_OPTIONS")
                    ;
                    local_6a9 = 1;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_b8,"AUTOUIC_OPTIONS");
                    if (bVar2) {
                      std::__cxx11::string::operator=
                                ((string *)local_6a8,"INTERFACE_AUTOUIC_OPTIONS");
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_b8,"INTERFACE_AUTOUIC_OPTIONS");
                      if (bVar2) {
                        std::__cxx11::string::operator=
                                  ((string *)local_6a8,"INTERFACE_AUTOUIC_OPTIONS");
                        local_6a9 = 1;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_b8,"SOURCES");
                        if (bVar2) {
                          std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_SOURCES");
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"INTERFACE_SOURCES");
                          if (bVar2) {
                            std::__cxx11::string::operator=((string *)local_6a8,"INTERFACE_SOURCES")
                            ;
                            local_6a9 = 1;
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"COMPILE_FEATURES");
                            if (bVar2) {
                              std::__cxx11::string::operator=
                                        ((string *)local_6a8,"INTERFACE_COMPILE_FEATURES");
                            }
                            else {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"INTERFACE_COMPILE_FEATURES");
                              if (bVar2) {
                                std::__cxx11::string::operator=
                                          ((string *)local_6a8,"INTERFACE_COMPILE_FEATURES");
                                local_6a9 = 1;
                              }
                              else {
                                pcStack_6b8 = (char *)std::__cxx11::string::c_str();
                                bVar2 = cmHasLiteralPrefix<char_const*,21ul>
                                                  (&stack0xfffffffffffff948,(char (*) [21])0x9164ac)
                                ;
                                if ((bVar2) &&
                                   ((headTarget._4_4_ =
                                          cmLocalGenerator::GetPolicyStatus
                                                    ((cmLocalGenerator *)
                                                     content_local[4].IdentifierChildren.
                                                                                                          
                                                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,CMP0043
                                                  ), headTarget._4_4_ == WARN ||
                                    (headTarget._4_4_ == OLD)))) {
                                  std::__cxx11::string::operator=
                                            ((string *)local_6a8,"INTERFACE_COMPILE_DEFINITIONS");
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((content_local[5].IdentifierChildren.
         super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) || ((local_6a9 & 1) == 0)) {
      local_970 = (cmGeneratorTarget *)propertyName.field_2._8_8_;
    }
    else {
      local_970 = (cmGeneratorTarget *)
                  content_local[5].IdentifierChildren.
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    }
    iface = (cmLinkInterfaceLibraries *)local_970;
    if ((local_6a9 & 1) == 0) {
      uVar11 = std::__cxx11::string::empty();
      if (((uVar11 & 1) == 0) &&
         (local_6f8 = cmGeneratorTarget::GetLinkImplementationLibraries
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                 (string *)
                                 &content_local[4].IdentifierChildren.
                                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage),
         local_6f8 != (cmLinkImplementationLibraries *)0x0)) {
        getLinkedTargetsContent<cmLinkImplItem>
                  (&local_718,&local_6f8->Libraries,(cmGeneratorTarget *)propertyName.field_2._8_8_,
                   (cmGeneratorTarget *)propertyName.field_2._8_8_,
                   (cmGeneratorExpressionContext *)content_local,
                   (cmGeneratorExpressionDAGChecker *)local_5f0,(string *)local_6a8);
        std::__cxx11::string::operator=
                  ((string *)(interfacePropertyName.field_2._M_local_buf + 8),(string *)&local_718);
        std::__cxx11::string::~string((string *)&local_718);
      }
    }
    else {
      local_6d0 = cmGeneratorTarget::GetLinkInterfaceLibraries
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                             (string *)
                             &content_local[4].IdentifierChildren.
                              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_970,true);
      if (local_6d0 != (cmLinkInterfaceLibraries *)0x0) {
        getLinkedTargetsContent<cmLinkItem>
                  ((string *)&impl,&local_6d0->Libraries,
                   (cmGeneratorTarget *)propertyName.field_2._8_8_,(cmGeneratorTarget *)iface,
                   (cmGeneratorExpressionContext *)content_local,
                   (cmGeneratorExpressionDAGChecker *)local_5f0,(string *)local_6a8);
        std::__cxx11::string::operator=
                  ((string *)(interfacePropertyName.field_2._M_local_buf + 8),(string *)&impl);
        std::__cxx11::string::~string((string *)&impl);
      }
    }
    if (local_620 == (char *)0x0) {
      bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)propertyName.field_2._8_8_);
      if ((bVar2) ||
         (TVar8 = cmGeneratorTarget::GetType((cmGeneratorTarget *)propertyName.field_2._8_8_),
         TVar8 == INTERFACE_LIBRARY)) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   (string *)(interfacePropertyName.field_2._M_local_buf + 8));
      }
      else {
        bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                          ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                           (string *)
                           &content_local[4].IdentifierChildren.
                            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          *(undefined1 *)
           ((long)&content_local[5].ParamChildren.
                   super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
          bVar2 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                             (string *)
                             &content_local[4].IdentifierChildren.
                              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            local_998 = "1";
          }
          else {
            local_998 = "0";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,local_998,
                     (allocator *)((long)&propContent + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&propContent + 7));
        }
        else {
          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                             (string *)
                             &content_local[4].IdentifierChildren.
                              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            *(undefined1 *)
             ((long)&content_local[5].ParamChildren.
                     super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
            local_728 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                  ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                   (string *)local_b8,
                                   (string *)
                                   &content_local[4].IdentifierChildren.
                                    super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_9c0 = local_728;
            if (local_728 == (char *)0x0) {
              local_9c0 = "";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,local_9c0,
                       (allocator *)((long)&propContent_1 + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_1 + 7));
          }
          else {
            bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                              ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                               (string *)
                               &content_local[4].IdentifierChildren.
                                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar2) {
              *(undefined1 *)
               ((long)&content_local[5].ParamChildren.
                       super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
              local_738 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                    ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                     (string *)local_b8,
                                     (string *)
                                     &content_local[4].IdentifierChildren.
                                      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_9e8 = local_738;
              if (local_738 == (char *)0x0) {
                local_9e8 = "";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,local_9e8,
                         (allocator *)((long)&propContent_2 + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_2 + 7));
            }
            else {
              bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                                 (string *)
                                 &content_local[4].IdentifierChildren.
                                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar2) {
                *(undefined1 *)
                 ((long)&content_local[5].ParamChildren.
                         super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
                local_748 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                       (string *)local_b8,
                                       (string *)
                                       &content_local[4].IdentifierChildren.
                                        super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                local_a10 = local_748;
                if (local_748 == (char *)0x0) {
                  local_a10 = "";
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,local_a10,
                           (allocator *)((long)&propContent_3 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_3 + 7));
              }
              else {
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,
                           (string *)(interfacePropertyName.field_2._M_local_buf + 8));
              }
            }
          }
        }
      }
    }
    else {
      bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)propertyName.field_2._8_8_);
      if (((bVar2) || (local_38 == (cmGeneratorExpressionDAGChecker *)0x0)) ||
         (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(local_38,(char *)0x0),
         bVar2)) {
LAB_005f9585:
        uVar11 = std::__cxx11::string::empty();
        pcVar13 = local_620;
        if ((uVar11 & 1) == 0) {
          local_76a = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_790,pcVar13,&local_791);
          cmGeneratorExpressionNode::EvaluateDependentExpression
                    (__return_storage_ptr__,&local_790,
                     (cmLocalGenerator *)
                     content_local[4].IdentifierChildren.
                     super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (cmGeneratorExpressionContext *)content_local,(cmGeneratorTarget *)iface,
                     (cmGeneratorTarget *)propertyName.field_2._8_8_,
                     (cmGeneratorExpressionDAGChecker *)local_5f0);
          std::__cxx11::string::~string((string *)&local_790);
          std::allocator<char>::~allocator((allocator<char> *)&local_791);
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            cVar4 = std::__cxx11::string::empty();
            pcVar13 = ";";
            if (cVar4 != '\0') {
              pcVar13 = "";
            }
            std::operator+(&local_7b8,pcVar13,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&interfacePropertyName.field_2 + 8));
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7b8);
            std::__cxx11::string::~string((string *)&local_7b8);
          }
          local_76a = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar13,&local_7b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
        }
      }
      else {
        bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                          ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                           (string *)
                           &content_local[4].IdentifierChildren.
                            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          *(undefined1 *)
           ((long)&content_local[5].ParamChildren.
                   super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
          local_758 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                                 (string *)
                                 &content_local[4].IdentifierChildren.
                                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_a38 = local_758;
          if (local_758 == (char *)0x0) {
            local_a38 = "";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,local_a38,
                     (allocator *)((long)&propContent_4 + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_4 + 7));
        }
        else {
          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                             (string *)
                             &content_local[4].IdentifierChildren.
                              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar2) goto LAB_005f9585;
          *(undefined1 *)
           ((long)&content_local[5].ParamChildren.
                   super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
          local_768 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                                 (string *)
                                 &content_local[4].IdentifierChildren.
                                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_a60 = local_768;
          if (local_768 == (char *)0x0) {
            local_a60 = "";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,local_a60,&local_769);
          std::allocator<char>::~allocator((allocator<char> *)&local_769);
        }
      }
    }
    local_108 = 1;
    std::__cxx11::string::~string((string *)local_6a8);
    std::__cxx11::string::~string((string *)(interfacePropertyName.field_2._M_local_buf + 8));
  }
LAB_005f97eb:
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_5f0);
LAB_005f9807:
  std::__cxx11::string::~string((string *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagCheckerParent
                      ) const
  {
    if (parameters.size() != 1 && parameters.size() != 2)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
      }
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = context->HeadTarget;
    std::string propertyName = *parameters.begin();

    if (parameters.size() == 1)
      {
      context->HadHeadSensitiveCondition = true;
      }
    if (!target && parameters.size() == 1)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
      return std::string();
      }

    if (parameters.size() == 2)
      {
      if (parameters.begin()->empty() && parameters[1].empty())
        {
        reportError(context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
            "target name and property name.");
        return std::string();
        }
      if (parameters.begin()->empty())
        {
        reportError(context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
            "target name.");
        return std::string();
        }

      std::string targetName = parameters.front();
      propertyName = parameters[1];
      if (!cmGeneratorExpression::IsValidTargetName(targetName))
        {
        if (!propertyNameValidator.find(propertyName.c_str()))
          {
          ::reportError(context, content->GetOriginalExpression(),
                        "Target name and property name not supported.");
          return std::string();
          }
        ::reportError(context, content->GetOriginalExpression(),
                      "Target name not supported.");
        return std::string();
        }
      if(propertyName == "ALIASED_TARGET")
        {
        if(context->LG->GetMakefile()->IsAlias(targetName))
          {
          if(cmGeneratorTarget* tgt =
             context->LG->FindGeneratorTargetToUse(targetName))
            {
            return tgt->GetName();
            }
          }
        return "";
        }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target)
        {
        std::ostringstream e;
        e << "Target \""
          << targetName
          << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
        }
      context->AllTargets.insert(target);
      }

    if (target == context->HeadTarget)
      {
      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);
      }
    if (propertyName == "SOURCES")
      {
      context->SourceSensitiveTargets.insert(target);
      }

    if (propertyName.empty())
      {
      reportError(context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:...> expression requires a non-empty property "
          "name.");
      return std::string();
      }

    if (!propertyNameValidator.find(propertyName))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
      }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE")
      {
      if (target->LinkLanguagePropagatesToDependents() &&
          dagCheckerParent && (dagCheckerParent->EvaluatingLinkLibraries()
            || dagCheckerParent->EvaluatingSources()))
        {
        reportError(context, content->GetOriginalExpression(),
            "LINKER_LANGUAGE target property can not be used while evaluating "
            "link libraries for a static library");
        return std::string();
        }
      return target->GetLinkerLanguage(context->Config);
      }

    cmGeneratorExpressionDAGChecker dagChecker(context->Backtrace,
                                               target->GetName(),
                                               propertyName,
                                               content,
                                               dagCheckerParent);

    switch (dagChecker.Check())
      {
    case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
      dagChecker.ReportError(context, content->GetOriginalExpression());
      return std::string();
    case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
      // No error. We just skip cyclic references.
      return std::string();
    case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
      for (size_t i = 1;
          i < cmArraySize(targetPropertyTransitiveWhitelist);
          ++i)
        {
        if (targetPropertyTransitiveWhitelist[i] == propertyName)
          {
          // No error. We're not going to find anything new here.
          return std::string();
          }
        }
    case cmGeneratorExpressionDAGChecker::DAG:
      break;
      }

    const char *prop = target->GetProperty(propertyName);

    if (dagCheckerParent)
      {
      if (dagCheckerParent->EvaluatingLinkLibraries())
        {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY) \
    (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(TRANSITIVE_PROPERTY_COMPARE)
            false)
          {
          reportError(context, content->GetOriginalExpression(),
              "$<TARGET_PROPERTY:...> expression in link libraries "
              "evaluation depends on target property which is transitive "
              "over the link libraries, creating a recursion.");
          return std::string();
          }
#undef TRANSITIVE_PROPERTY_COMPARE

        if(!prop)
          {
          return std::string();
          }
        }
      else
        {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) \
  dagCheckerParent->METHOD () ||

        assert(
          CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
                                            ASSERT_TRANSITIVE_PROPERTY_METHOD)
          false);
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
        }
      }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop) \
    if (propertyName == #prop) \
      { \
      interfacePropertyName = "INTERFACE_" #prop; \
      } \
    else if (propertyName == "INTERFACE_" #prop) \
      { \
      interfacePropertyName = "INTERFACE_" #prop; \
      isInterfaceProperty = true; \
      } \
    else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
      // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName.c_str(),
                           "COMPILE_DEFINITIONS_"))
      {
      cmPolicies::PolicyStatus polSt =
          context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD)
        {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
        }
      }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
        context->HeadTarget && isInterfaceProperty
                               ? context->HeadTarget : target;

    if(isInterfaceProperty)
      {
      if(cmLinkInterfaceLibraries const* iface =
         target->GetLinkInterfaceLibraries(context->Config, headTarget, true))
        {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target,
                                  headTarget,
                                  context, &dagChecker,
                                  interfacePropertyName);
        }
      }
    else if(!interfacePropertyName.empty())
      {
      if(cmLinkImplementationLibraries const* impl =
         target->GetLinkImplementationLibraries(context->Config))
        {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target,
                                  target,
                                  context, &dagChecker,
                                  interfacePropertyName);
        }
      }

    if (!prop)
      {
      if (target->IsImported()
          || target->GetType() == cmState::INTERFACE_LIBRARY)
        {
        return linkedTargetsContent;
        }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                     context->Config))
        {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(
                                                propertyName,
                                                context->Config) ? "1" : "0";
        }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                       context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                              target->GetLinkInterfaceDependentStringProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                          target->GetLinkInterfaceDependentNumberMinProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                          target->GetLinkInterfaceDependentNumberMaxProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }

      return linkedTargetsContent;
      }

    if (!target->IsImported()
        && dagCheckerParent && !dagCheckerParent->EvaluatingLinkLibraries())
      {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                            target->GetLinkInterfaceDependentNumberMinProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                            target->GetLinkInterfaceDependentNumberMaxProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      }
    if(!interfacePropertyName.empty())
      {
      std::string result = this->EvaluateDependentExpression(prop,
                                        context->LG, context,
                                        headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty())
        {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
        }
      return result;
      }
    return prop;
  }